

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O2

void osThread::Initialize(void)

{
  long lVar1;
  osThread **ppoVar2;
  long lVar3;
  
  builtin_strncpy(MainThread.Name,"main",5);
  pthread_key_create(&tlsKey,(__destr_function *)0x0);
  lVar3 = 0;
  do {
    if (lVar3 == 0x30) {
      IsInitialized = 1;
      return;
    }
    lVar1 = lVar3 + 1;
    ppoVar2 = Threads + lVar3;
    lVar3 = lVar1;
  } while (*ppoVar2 != (osThread *)0x0);
  *(osThread **)(&tlsKey + lVar1 * 2) = &MainThread;
  IsInitialized = 1;
  return;
}

Assistant:

void osThread::Initialize()
{
    // This is a hack to add the thread that called main() to the list
    snprintf(MainThread.Name, NAME_LENGTH_MAX, "main");
#ifdef _WIN32
    if ((dwTlsIndex = TlsAlloc()) == TLS_OUT_OF_INDEXES)
    {
        // ErrorExit( "TlsAlloc failed" );
    }
    TlsSetValue(dwTlsIndex, &MainThread);
#elif __linux__
    pthread_key_create(&tlsKey, nullptr);
#endif
    for (int i = 0; i < MAX_THREADS; i++)
    {
        if (Threads[i] == nullptr)
        {
            Threads[i] = &MainThread;
            break;
        }
    }
    IsInitialized = true;
}